

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall dxil_spv::CFGNode::block_is_jump_thread_ladder(CFGNode *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  value_type *phi;
  CFGNode *this_local;
  
  bVar1 = std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
          ::empty(&(this->ir).operations);
  if (((bVar1) && ((this->ir).terminator.type == Condition)) &&
     (sVar2 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::size
                        (&(this->ir).phi), sVar2 == 1)) {
    pvVar3 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::front
                       (&(this->ir).phi);
    this_local._7_1_ = (this->ir).terminator.conditional_id == pvVar3->id;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CFGNode::block_is_jump_thread_ladder() const
{
	if (!ir.operations.empty() || ir.terminator.type != Terminator::Type::Condition || ir.phi.size() != 1)
		return false;

	auto &phi = ir.phi.front();

	// Detect a jump thread block. If the branch target directly depends on the incoming blocks,
	// we have this scenario.
	return ir.terminator.conditional_id == phi.id;
}